

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O1

geo_argument GEO::hashit(string *inString)

{
  int iVar1;
  geo_argument gVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)inString);
  if (iVar1 == 0) {
    gVar2 = ePoint;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)inString);
    if (iVar1 == 0) {
      gVar2 = eChar_Len;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)inString);
      if (iVar1 == 0) {
        gVar2 = eLine;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)inString);
        gVar2 = eCurve_Loop;
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)inString);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)inString);
            gVar2 = ePlane_surface;
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)inString);
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)inString);
                if (iVar1 == 0) {
                  gVar2 = eSurface_loop;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)inString);
                  if (iVar1 == 0) {
                    gVar2 = eVolume;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)inString);
                    if (iVar1 == 0) {
                      gVar2 = ePhysical_Point;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)inString);
                      gVar2 = ePhysical_Curve;
                      if (iVar1 != 0) {
                        iVar1 = std::__cxx11::string::compare((char *)inString);
                        if (iVar1 != 0) {
                          iVar1 = std::__cxx11::string::compare((char *)inString);
                          if (iVar1 == 0) {
                            gVar2 = ePhysical_Surface;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)inString);
                            if (iVar1 == 0) {
                              gVar2 = ePhysical_Volume;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)inString);
                              if (iVar1 == 0) {
                                gVar2 = eMesh_Spacing;
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)inString);
                                if (iVar1 == 0) {
                                  gVar2 = eOpenCASCADE;
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare((char *)inString);
                                  gVar2 = (uint)(iVar1 != 0) * 3;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return gVar2;
}

Assistant:

GEO::geo_argument GEO::hashit(std::string const& inString)
{
    if (inString == "Point")            return GEO::ePoint;
    if (inString == "cl__1")            return GEO::eChar_Len;
    if (inString == "Line")             return GEO::eLine;
    if (inString == "Line Loop")        return GEO::eCurve_Loop;
    if (inString == "Curve Loop")       return GEO::eCurve_Loop;
    if (inString == "Plane Surface")    return GEO::ePlane_surface;
    if (inString == "Surface")          return GEO::ePlane_surface;
    if (inString == "Surface Loop")     return GEO::eSurface_loop;
    if (inString == "Volume")           return GEO::eVolume;
    if (inString == "Physical Point")   return GEO::ePhysical_Point;
    if (inString == "Physical Line")    return GEO::ePhysical_Curve;
    if (inString == "Physical Curve")   return GEO::ePhysical_Curve;
    if (inString == "Physical Surface") return GEO::ePhysical_Surface;
    if (inString == "Physical Volume")  return GEO::ePhysical_Volume;
    if (inString == "MeshSpac")         return GEO::eMesh_Spacing;
    if (inString == "SetFactory")       return GEO::eOpenCASCADE;
    if (inString == "")                 return GEO::eBlank_Space;
    return GEO::eDefault;
}